

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O0

const_iterator __thiscall
frozen::unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq>::
find<frozen::basic_string<char>>
          (unordered_set<frozen::basic_string<char>,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char> *key)

{
  bool bVar1;
  hasher *hasher;
  size_t sVar2;
  const_iterator pvVar3;
  string *frozen;
  key_equal *this_00;
  const_iterator it;
  size_t pos;
  basic_string<char> *key_local;
  unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<void>,_eq> *this_local;
  
  hasher = unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<void>,_eq>::hash_function
                     ((unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<void>,_eq> *)this
                     );
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<void>>::
          lookup<frozen::basic_string<char>,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)(this + 0x30),key,hasher);
  pvVar3 = bits::carray<frozen::basic_string<char>,_3UL>::begin
                     ((carray<frozen::basic_string<char>,_3UL> *)this);
  frozen = pvVar3 + sVar2;
  pvVar3 = bits::carray<frozen::basic_string<char>,_3UL>::end
                     ((carray<frozen::basic_string<char>,_3UL> *)this);
  if (frozen != pvVar3) {
    this_00 = unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<void>,_eq>::key_eq
                        ((unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<void>,_eq> *)
                         this);
    bVar1 = eq::operator()(this_00,frozen,key);
    if (bVar1) {
      return frozen;
    }
  }
  pvVar3 = bits::carray<frozen::basic_string<char>,_3UL>::end
                     ((carray<frozen::basic_string<char>,_3UL> *)this);
  return pvVar3;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }